

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Vec<float,_4UL> *v)

{
  undefined4 uVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  int i;
  long lVar5;
  
  std::operator<<(os,'[');
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(os,v->data[lVar5]);
    std::operator<<(poVar2,", ");
  }
  poVar2 = (ostream *)std::ostream::operator<<(os,v->data[3]);
  puVar4 = (undefined4 *)0x5d;
  std::operator<<(poVar2,']');
  puVar3 = (undefined8 *)operator_new(0x10);
  uVar1 = *puVar4;
  *puVar3 = &PTR_foo_00106c68;
  *(undefined4 *)(puVar3 + 1) = uVar1;
  *(undefined8 **)poVar2 = puVar3;
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }